

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryWriter::writeField(WasmBinaryWriter *this,Field *field)

{
  PackedType PVar1;
  Type type;
  S32LEB x;
  BufferWithRandomAccess *this_00;
  
  type.id = (field->type).id;
  if ((type.id == 2) && (PVar1 = field->packedType, PVar1 != not_packed)) {
    if (PVar1 == i16) {
      this_00 = this->o;
      x.value = -9;
    }
    else {
      if (PVar1 != i8) {
        handle_unreachable("invalid packed type",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                           ,0x6e3);
      }
      this_00 = this->o;
      x.value = -8;
    }
    BufferWithRandomAccess::operator<<(this_00,x);
  }
  else {
    writeType(this,type);
  }
  BufferWithRandomAccess::operator<<(this->o,(U32LEB)field->mutable_);
  return;
}

Assistant:

void WasmBinaryWriter::writeField(const Field& field) {
  if (field.type == Type::i32 && field.packedType != Field::not_packed) {
    if (field.packedType == Field::i8) {
      o << S32LEB(BinaryConsts::EncodedType::i8);
    } else if (field.packedType == Field::i16) {
      o << S32LEB(BinaryConsts::EncodedType::i16);
    } else {
      WASM_UNREACHABLE("invalid packed type");
    }
  } else {
    writeType(field.type);
  }
  o << U32LEB(field.mutable_);
}